

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

void save_node_stats(log_multi *d)

{
  long lVar1;
  FILE *__stream;
  node *pnVar2;
  node_pred *pnVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  __stream = fopen64("atxm_debug.csv","wt");
  pnVar2 = (d->nodes)._begin;
  if ((d->nodes)._end != pnVar2) {
    uVar4 = 0;
    do {
      fprintf(__stream,"Node: %4d, Internal: %1d, Eh: %7.4f, n: %6d, \n",
              pnVar2[uVar4].Eh / (double)pnVar2[uVar4].n,uVar4,(ulong)pnVar2[uVar4].internal);
      fwrite("Label:, ",8,1,__stream);
      pnVar2 = (d->nodes)._begin;
      pnVar3 = pnVar2[uVar4].preds._begin;
      if (pnVar2[uVar4].preds._end != pnVar3) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          fprintf(__stream,"%6d,",(ulong)pnVar3[uVar5].label);
          pnVar2 = (d->nodes)._begin;
          pnVar3 = pnVar2[uVar4].preds._begin;
          uVar5 = ((long)pnVar2[uVar4].preds._end - (long)pnVar3 >> 3) * -0x5555555555555555;
          bVar8 = uVar6 <= uVar5;
          lVar1 = uVar5 - uVar6;
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar8 && lVar1 != 0);
      }
      fputc(10,__stream);
      fwrite("Ehk:, ",6,1,__stream);
      pnVar2 = (d->nodes)._begin;
      pnVar3 = pnVar2[uVar4].preds._begin;
      if (pnVar2[uVar4].preds._end != pnVar3) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          fprintf(__stream,"%7.4f,",pnVar3[uVar5].Ehk / (double)pnVar3[uVar5].nk);
          pnVar2 = (d->nodes)._begin;
          pnVar3 = pnVar2[uVar4].preds._begin;
          uVar5 = ((long)pnVar2[uVar4].preds._end - (long)pnVar3 >> 3) * -0x5555555555555555;
          bVar8 = uVar6 <= uVar5;
          lVar1 = uVar5 - uVar6;
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar8 && lVar1 != 0);
      }
      fputc(10,__stream);
      fwrite("nk:, ",5,1,__stream);
      pnVar2 = (d->nodes)._begin;
      pnVar3 = pnVar2[uVar4].preds._begin;
      if (pnVar2[uVar4].preds._end == pnVar3) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        uVar5 = 0;
        uVar6 = 1;
        do {
          fprintf(__stream,"%6d,",(ulong)pnVar3[uVar5].nk);
          pnVar2 = (d->nodes)._begin;
          pnVar3 = pnVar2[uVar4].preds._begin;
          uVar7 = uVar7 + pnVar3[uVar5].nk;
          uVar5 = ((long)pnVar2[uVar4].preds._end - (long)pnVar3 >> 3) * -0x5555555555555555;
          bVar8 = uVar6 <= uVar5;
          lVar1 = uVar5 - uVar6;
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar8 && lVar1 != 0);
      }
      fputc(10,__stream);
      pnVar2 = (d->nodes)._begin;
      fprintf(__stream,"max(lab:cnt:tot):, %3d,%6d,%7d,\n",(ulong)pnVar2[uVar4].max_count_label,
              (ulong)pnVar2[uVar4].max_count,(ulong)uVar7);
      pnVar2 = (d->nodes)._begin;
      fprintf(__stream,"left: %4d, right: %4d",(ulong)pnVar2[uVar4].left,(ulong)pnVar2[uVar4].right)
      ;
      fwrite("\n\n",2,1,__stream);
      uVar4 = (ulong)((int)uVar4 + 1);
      pnVar2 = (d->nodes)._begin;
      uVar5 = ((long)(d->nodes)._end - (long)pnVar2 >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
  }
  fclose(__stream);
  return;
}

Assistant:

void save_node_stats(log_multi& d)
{
  FILE* fp;
  uint32_t i, j;
  uint32_t total;
  log_multi* b = &d;

  fp = fopen("atxm_debug.csv", "wt");

  for (i = 0; i < b->nodes.size(); i++)
  {
    fprintf(fp, "Node: %4d, Internal: %1d, Eh: %7.4f, n: %6d, \n", (int)i, (int)b->nodes[i].internal,
        b->nodes[i].Eh / b->nodes[i].n, b->nodes[i].n);

    fprintf(fp, "Label:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%6d,", (int)b->nodes[i].preds[j].label);
    }
    fprintf(fp, "\n");

    fprintf(fp, "Ehk:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%7.4f,", b->nodes[i].preds[j].Ehk / b->nodes[i].preds[j].nk);
    }
    fprintf(fp, "\n");

    total = 0;

    fprintf(fp, "nk:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%6d,", (int)b->nodes[i].preds[j].nk);
      total += b->nodes[i].preds[j].nk;
    }
    fprintf(fp, "\n");

    fprintf(fp, "max(lab:cnt:tot):, %3d,%6d,%7d,\n", (int)b->nodes[i].max_count_label, (int)b->nodes[i].max_count,
        (int)total);
    fprintf(fp, "left: %4d, right: %4d", (int)b->nodes[i].left, (int)b->nodes[i].right);
    fprintf(fp, "\n\n");
  }

  fclose(fp);
}